

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR eval_relative_location_path
                 (lyxp_expr *exp,uint32_t *tok_idx,ly_bool all_desc,lyxp_set *set,uint32_t options)

{
  ushort uVar1;
  lyxp_set_type lVar2;
  uint uVar3;
  lyxp_node_type lVar4;
  lyxp_set_node *plVar5;
  byte *pbVar6;
  long lVar7;
  ly_path_predicate *predicates;
  lyd_node *plVar8;
  ly_ctx *plVar9;
  LY_ERR ret__;
  int iVar10;
  uint uVar11;
  LY_ERR LVar12;
  char *pcVar13;
  lyxp_set *set_00;
  lyxp_set_scnode *plVar14;
  lys_module *plVar15;
  lysc_node *plVar16;
  lysc_node *plVar17;
  lysc_node *plVar18;
  lys_module *plVar19;
  char *pcVar20;
  lysc_when *plVar21;
  char cVar22;
  lyxp_token lVar23;
  LY_ERR LVar24;
  long lVar25;
  ulong uVar26;
  char *pcVar27;
  lyxp_set_scnode *plVar28;
  uint32_t uVar29;
  undefined4 uVar30;
  char *pcVar31;
  ly_ctx *plVar32;
  undefined8 uVar33;
  lyxp_axis axis;
  ulong uVar34;
  lyd_node *plVar35;
  lyd_meta *plVar36;
  bool bVar37;
  uint local_164;
  lys_module *local_148;
  lysc_node *local_140;
  uint32_t ncname_len;
  lys_module *moveto_mod;
  char *local_128;
  char *ncname_dict;
  ulong local_118;
  char *ncname;
  lyd_node *local_108;
  lyd_node *sub;
  lyd_node *local_f8;
  ly_path_predicate *local_f0;
  uint local_e8;
  lyxp_node_type local_e4;
  ly_ctx *local_e0;
  ulong local_d8;
  char *local_d0;
  lyxp_set local_c8;
  
  local_d0 = "parsed";
  if (set == (lyxp_set *)0x0) {
    local_d0 = "skipped";
  }
  uVar11 = *tok_idx;
  local_164 = options;
  do {
    uVar34 = (ulong)uVar11;
    lVar23 = exp->tokens[uVar34];
    if (lVar23 == LYXP_TOKEN_AT) {
      pcVar31 = "skipped";
      if ((local_164 & 0x20) == 0) {
        pcVar31 = "parsed";
      }
      axis = LYXP_AXIS_ATTRIBUTE;
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,"@",
                 (ulong)exp->tok_pos[uVar34]);
LAB_001ab3da:
      uVar34 = (ulong)(*tok_idx + 1);
      *tok_idx = *tok_idx + 1;
      lVar23 = exp->tokens[uVar34];
    }
    else {
      if (lVar23 == LYXP_TOKEN_AXISNAME) {
        if (exp->tok_len[uVar34] - 4 < 0xf) {
          pcVar31 = exp->expr + exp->tok_pos[uVar34];
          switch(exp->tok_len[uVar34]) {
          case 4:
            iVar10 = strncmp("self",pcVar31,4);
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xaf,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            axis = LYXP_AXIS_SELF;
            break;
          case 5:
            iVar10 = strncmp("child",pcVar31,5);
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"child\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb2,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            axis = LYXP_AXIS_CHILD;
            break;
          case 6:
            iVar10 = strncmp("parent",pcVar31,6);
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"parent\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb5,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            axis = LYXP_AXIS_PARENT;
            break;
          default:
            goto switchD_001ab108_caseD_7;
          case 8:
            iVar10 = strncmp("ancestor",pcVar31,8);
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"ancestor\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb8,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            axis = LYXP_AXIS_ANCESTOR;
            break;
          case 9:
            if (*pcVar31 == 'f') {
              iVar10 = strncmp("following",pcVar31,9);
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"following\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xbf,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
              axis = LYXP_AXIS_FOLLOWING;
            }
            else if (*pcVar31 == 'a') {
              iVar10 = strncmp("attribute",pcVar31,9);
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"attribute\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xbc,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
              axis = LYXP_AXIS_ATTRIBUTE;
            }
            else {
              iVar10 = strncmp("preceding",pcVar31,9);
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"preceding\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xc2,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
              axis = LYXP_AXIS_PRECEDING;
            }
            break;
          case 10:
            iVar10 = strncmp("descendant",pcVar31,10);
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"descendant\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,199,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            axis = LYXP_AXIS_DESCENDANT;
            break;
          case 0x10:
            iVar10 = strncmp("ancestor-or-self",pcVar31,0x10);
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"ancestor-or-self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xca,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            axis = LYXP_AXIS_ANCESTOR_OR_SELF;
            break;
          case 0x11:
            if (*pcVar31 == 'f') {
              iVar10 = strncmp("following-sibling",pcVar31,0x11);
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"following-sibling\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xce,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
              axis = LYXP_AXIS_FOLLOWING_SIBLING;
            }
            else {
              iVar10 = strncmp("preceding-sibling",pcVar31,0x11);
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"preceding-sibling\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xd1,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
              axis = LYXP_AXIS_PRECEDING_SIBLING;
            }
            break;
          case 0x12:
            iVar10 = strncmp("descendant-or-self",pcVar31,0x12);
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"descendant-or-self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xd6,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            axis = LYXP_AXIS_DESCENDANT_OR_SELF;
          }
          lVar23 = LYXP_TOKEN_AXISNAME;
        }
        else {
switchD_001ab108_caseD_7:
          axis = LYXP_AXIS_ANCESTOR;
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0xda);
          lVar23 = exp->tokens[*tok_idx];
        }
        pcVar31 = "skipped";
        if ((local_164 & 0x20) == 0) {
          pcVar31 = "parsed";
        }
        pcVar13 = lyxp_token2str(lVar23);
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,pcVar13,
                   (ulong)exp->tok_pos[*tok_idx]);
        uVar11 = *tok_idx + 1;
        *tok_idx = uVar11;
        if (exp->tokens[uVar11] != LYXP_TOKEN_DCOLON) {
          __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x20d4,
                        "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,"::",
                   (ulong)exp->tok_pos[uVar11]);
        goto LAB_001ab3da;
      }
      axis = LYXP_AXIS_CHILD;
    }
    switch(lVar23) {
    case LYXP_TOKEN_DOT:
      lVar23 = LYXP_TOKEN_DOT;
      if ((local_164 & 0x20) == 0) {
        uVar34 = (ulong)set->type;
        if ((local_164 & 0x1c) == 0) {
          if (uVar34 == 0) goto LAB_001ab7e8;
        }
        else if (set->type == LYXP_SET_SCNODE_SET) {
LAB_001ab7e8:
          if ((all_desc != '\0') &&
             (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,local_164),
             LVar12 != LY_SUCCESS)) {
            return LVar12;
          }
          LVar12 = xpath_pi_node(set,LYXP_AXIS_SELF,local_164);
          if (LVar12 != LY_SUCCESS) {
            return LVar12;
          }
          lVar23 = exp->tokens[*tok_idx];
          goto LAB_001ab838;
        }
LAB_001ac8b6:
        plVar32 = set->ctx;
        if ((uint)uVar34 < 5) {
          pcVar13 = *(char **)(&DAT_001fe650 + uVar34 * 8);
        }
        else {
          pcVar13 = (char *)0x0;
        }
        pcVar27 = "Cannot apply XPath operation %s on %s.";
        pcVar31 = "path operator";
LAB_001ac8dd:
        ly_vlog(plVar32,(char *)0x0,LYVE_XPATH,pcVar27,pcVar31,pcVar13);
        return LY_EVALID;
      }
LAB_001ab838:
      pcVar13 = lyxp_token2str(lVar23);
      uVar11 = exp->tok_pos[*tok_idx];
      pcVar31 = local_d0;
      goto LAB_001ab85b;
    case LYXP_TOKEN_DDOT:
      lVar23 = LYXP_TOKEN_DDOT;
      pcVar31 = "skipped";
      if ((local_164 & 0x20) == 0) {
        uVar34 = (ulong)set->type;
        if ((local_164 & 0x1c) == 0) {
          if (uVar34 == 0) goto LAB_001ab770;
        }
        else if (set->type == LYXP_SET_SCNODE_SET) {
LAB_001ab770:
          if ((all_desc != '\0') &&
             (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,local_164),
             LVar12 != LY_SUCCESS)) {
            return LVar12;
          }
          LVar12 = xpath_pi_node(set,LYXP_AXIS_PARENT,local_164);
          if (LVar12 != LY_SUCCESS) {
            return LVar12;
          }
          lVar23 = exp->tokens[*tok_idx];
          pcVar31 = "parsed";
          goto LAB_001ab7bb;
        }
        goto LAB_001ac8b6;
      }
LAB_001ab7bb:
      pcVar13 = lyxp_token2str(lVar23);
      uVar11 = exp->tok_pos[*tok_idx];
LAB_001ab85b:
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,pcVar13,(ulong)uVar11);
      *tok_idx = *tok_idx + 1;
      break;
    default:
      plVar32 = set->ctx;
      uVar33 = 0x2126;
LAB_001ac8ad:
      ly_log(plVar32,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",uVar33
            );
      return LY_EINT;
    case LYXP_TOKEN_NAMETEST:
      ncname_dict = (char *)0x0;
      moveto_mod = (lys_module *)0x0;
      local_f0 = (ly_path_predicate *)0x0;
      pcVar31 = "parsed";
      if ((local_164 & 0x20) != 0) {
        pcVar31 = "skipped";
      }
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_name_test_with_predicate",pcVar31,"NameTest");
      uVar11 = *tok_idx;
      *tok_idx = uVar11 + 1;
      local_140 = (lysc_node *)0x0;
      if ((local_164 & 0x20) == 0) {
        ncname = exp->expr + exp->tok_pos[uVar11];
        ncname_len = exp->tok_len[uVar11];
        if (exp->expr[exp->tok_pos[uVar11]] == '*' && ncname_len == 1) {
LAB_001ab5ce:
          local_140 = (lysc_node *)0x0;
          goto LAB_001ab5d0;
        }
        LVar12 = moveto_resolve_model(&ncname,&ncname_len,set,(lysc_node *)0x0,&moveto_mod);
        if (LVar12 == LY_SUCCESS) {
          if ((*ncname != '*') || (ncname_len != 1)) {
            if ((all_desc == '\0') &&
               ((((axis == LYXP_AXIS_CHILD &&
                  (set->format == LY_VALUE_JSON || moveto_mod != (lys_module *)0x0)) &&
                 (set->type == LYXP_SET_NODE_SET)) && (set->used != 0)))) {
              uVar34 = 0;
              local_140 = (lysc_node *)0x0;
              do {
                plVar32 = set->ctx;
                plVar35 = (set->val).nodes[uVar34].node;
                local_128 = ncname;
                uVar26 = (ulong)ncname_len;
                local_e4 = set->root_type;
                local_c8.type = LYXP_SET_NODE_SET;
                local_118 = CONCAT44(local_118._4_4_,set->format);
                local_148 = moveto_mod;
                plVar8 = plVar35;
                plVar9 = plVar32;
                local_d8 = uVar34;
                if (moveto_mod == (lys_module *)0x0 && set->format != LY_VALUE_JSON) {
                  __assert_fail("(format == LY_VALUE_JSON) || moveto_mod",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                ,0x1f3b,
                                "LY_ERR eval_name_test_with_predicate_get_scnode(const struct ly_ctx *, const struct lyd_node *, const char *, uint32_t, const struct lys_module *, enum lyxp_node_type, LY_VALUE_FORMAT, const struct lysc_node **)"
                               );
                }
                do {
                  local_e0 = plVar9;
                  local_f8 = plVar8;
                  if (plVar35 == (lyd_node *)0x0) {
                    if (((int)local_118 == 4) && (local_148 == (lys_module *)0x0)) {
                      plVar19 = ly_ctx_get_module_iter(plVar32,&local_c8.type);
                      pcVar31 = local_128;
                      while( true ) {
                        if (plVar19 == (lys_module *)0x0) goto LAB_001abedd;
                        if ((plVar19->implemented != '\0') &&
                           (plVar16 = lys_find_child((lysc_node *)0x0,plVar19,pcVar31,uVar26,0,0),
                           plVar16 != (lysc_node *)0x0)) break;
                        plVar19 = ly_ctx_get_module_iter(plVar32,&local_c8.type);
                      }
                      local_148 = (lys_module *)0x0;
                    }
                    else {
                      plVar16 = lys_find_child((lysc_node *)0x0,local_148,local_128,uVar26,0,0);
                    }
LAB_001abe8b:
                    plVar35 = local_f8;
                    if ((local_e4 == LYXP_NODE_ROOT_CONFIG) && (plVar16 != (lysc_node *)0x0)) {
                      if ((plVar16->flags & 2) == 0) {
LAB_001abeb9:
                        bVar37 = local_140 != (lysc_node *)0x0;
                        local_140 = plVar16;
                        if (bVar37) goto LAB_001ac456;
                      }
                    }
                    else if (plVar16 != (lysc_node *)0x0) goto LAB_001abeb9;
                  }
                  else {
                    plVar16 = plVar35->schema;
                    if (plVar16 != (lysc_node *)0x0) {
                      if (local_140 != (lysc_node *)0x0) {
                        plVar17 = lysc_data_node(local_140->parent);
                        plVar16 = plVar35->schema;
                        if (plVar17 == plVar16) goto LAB_001abec7;
                      }
                      if (((int)local_118 == 4) && (local_148 == (lys_module *)0x0)) {
                        local_148 = plVar16->module;
                      }
                      local_e8 = (uint)plVar16->nodetype;
                      plVar16 = lys_find_child(plVar16,local_148,local_128,uVar26,0,0);
                      plVar32 = local_e0;
                      if ((local_e8 & 0x300) != 0) {
                        plVar18 = lys_find_child(plVar35->schema,local_148,local_128,uVar26,0,0x10);
                        plVar17 = (lysc_node *)0x0;
                        if (plVar16 == (lysc_node *)0x0) {
                          plVar17 = plVar18;
                        }
                        plVar32 = local_e0;
                        if (plVar18 != (lysc_node *)0x0) {
                          plVar16 = plVar17;
                        }
                      }
                      goto LAB_001abe8b;
                    }
                  }
LAB_001abec7:
                  plVar8 = local_f8;
                  plVar9 = local_e0;
                } while (local_c8.type != LYXP_SET_NODE_SET);
LAB_001abedd:
                uVar34 = local_d8 + 1;
              } while (uVar34 < set->used);
              if ((local_140 != (lysc_node *)0x0) &&
                 (((local_140->nodetype & 0x18) == 0 ||
                  (LVar12 = eval_name_test_try_compile_predicates
                                      (exp,tok_idx,local_140,set,&local_f0), LVar12 == LY_SUCCESS)))
                 ) goto LAB_001ab5d0;
            }
LAB_001ac456:
            LVar12 = lydict_insert(set->ctx,ncname,(ulong)ncname_len,&ncname_dict);
            if (LVar12 != LY_SUCCESS) goto LAB_001ab6de;
          }
          goto LAB_001ab5ce;
        }
LAB_001ab6de:
        local_140 = (lysc_node *)0x0;
      }
      else {
LAB_001ab5d0:
        predicates = local_f0;
        pcVar31 = ncname_dict;
        plVar19 = moveto_mod;
        bVar37 = (local_164 & 0x1c) != 0;
        cVar22 = (char)((local_164 & 0x20) >> 5);
        uVar29 = local_164;
        if (axis == LYXP_AXIS_ATTRIBUTE) {
          if (bVar37 && cVar22 == '\0') {
            uVar11 = set->used;
            if ((ulong)uVar11 != 0) {
              lVar25 = 0;
              do {
                iVar10 = *(int *)((long)&((set->val).nodes)->pos + lVar25);
                if (iVar10 == 2) {
                  uVar30 = 0;
LAB_001ab720:
                  *(undefined4 *)((long)&((set->val).nodes)->pos + lVar25) = uVar30;
                }
                else if (iVar10 == -2) {
                  uVar30 = 0xffffffff;
                  goto LAB_001ab720;
                }
                lVar25 = lVar25 + 0x18;
              } while ((ulong)uVar11 * 0x18 != lVar25);
            }
LAB_001ac3a6:
            LVar24 = LY_SUCCESS;
          }
          else if (all_desc == '\0') {
            LVar24 = LY_SUCCESS;
            if ((local_164 & 0x20) != 0) goto LAB_001abf47;
            lVar25 = (long)(int)set->type;
            if (lVar25 != 0) goto LAB_001ac0b5;
            if (set->used != 0) {
              uVar34 = 0;
              do {
                if (((set->val).nodes[uVar34].type == LYXP_NODE_ELEM) &&
                   (plVar36 = ((set->val).nodes[uVar34].node)->meta, plVar36 != (lyd_meta *)0x0)) {
                  bVar37 = false;
                  do {
                    if (((plVar19 == (lys_module *)0x0) || (plVar36->annotation->module == plVar19))
                       && ((pcVar31 == (char *)0x0 || (plVar36->name == pcVar31)))) {
                      if (bVar37) {
                        set_insert_node(set,(lyd_node *)plVar36,(set->val).nodes[uVar34].pos,
                                        LYXP_NODE_META,(int)uVar34 + 1);
                      }
                      else {
                        (set->val).nodes[uVar34].node = (lyd_node *)plVar36;
                        (set->val).nodes[uVar34].type = LYXP_NODE_META;
                      }
                      uVar34 = (ulong)((int)uVar34 + 1);
                      bVar37 = true;
                    }
                    plVar36 = plVar36->next;
                  } while (plVar36 != (lyd_meta *)0x0);
                  if (!bVar37) goto LAB_001ac2c1;
                }
                else {
LAB_001ac2c1:
                  set_remove_node(set,(uint32_t)uVar34);
                }
              } while ((uint)uVar34 < set->used);
LAB_001ac2dd:
              LVar24 = LY_SUCCESS;
            }
          }
          else if ((local_164 & 0x20) == 0) {
            lVar25 = (long)(int)set->type;
            if (lVar25 != 0) {
LAB_001ac0b5:
              if ((uint)lVar25 < 5) {
                uVar33 = *(undefined8 *)(&DAT_001fe698 + lVar25 * 8);
              }
              else {
                uVar33 = 0;
              }
              ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                      "path operator",uVar33);
              LVar12 = LY_EVALID;
              goto LAB_001ac3f1;
            }
            set_00 = set_copy(set);
            LVar12 = moveto_node_alldesc_child(set_00,(lys_module *)0x0,(char *)0x0,local_164);
            if ((LVar12 != LY_SUCCESS) || (LVar12 = moveto_union(set,set_00), LVar12 != LY_SUCCESS))
            {
              if (set_00 != (lyxp_set *)0x0) {
                lyxp_set_free_content(set_00);
                free(set_00);
              }
              goto LAB_001ac3f1;
            }
            if (set_00 != (lyxp_set *)0x0) {
              lyxp_set_free_content(set_00);
              free(set_00);
            }
            LVar24 = LY_SUCCESS;
            if (set->used != 0) {
              uVar34 = 0;
              do {
                if (((set->val).nodes[uVar34].type == LYXP_NODE_ELEM) &&
                   (plVar36 = ((set->val).nodes[uVar34].node)->meta, plVar36 != (lyd_meta *)0x0)) {
                  bVar37 = false;
                  do {
                    if (((plVar19 == (lys_module *)0x0) || (plVar36->annotation->module == plVar19))
                       && ((pcVar31 == (char *)0x0 || (plVar36->name == pcVar31)))) {
                      if (bVar37) {
                        set_insert_node(set,(lyd_node *)plVar36,(set->val).nodes[uVar34].pos,
                                        LYXP_NODE_META,(int)uVar34 + 1);
                      }
                      else {
                        (set->val).nodes[uVar34].node = (lyd_node *)plVar36;
                        (set->val).nodes[uVar34].type = LYXP_NODE_META;
                      }
                      uVar34 = (ulong)((int)uVar34 + 1);
                      bVar37 = true;
                    }
                    plVar36 = plVar36->next;
                  } while (plVar36 != (lyd_meta *)0x0);
                  if (!bVar37) goto LAB_001ac693;
                }
                else {
LAB_001ac693:
                  set_remove_node(set,(uint32_t)uVar34);
                }
              } while ((uint)uVar34 < set->used);
              goto LAB_001ac2dd;
            }
          }
          else {
LAB_001abf47:
            LVar24 = LY_SUCCESS;
          }
        }
        else {
          if (!bVar37 || cVar22 != '\0') {
            if (axis == LYXP_AXIS_CHILD && all_desc != '\0') {
              LVar12 = moveto_node_alldesc_child(set,moveto_mod,ncname_dict,local_164);
            }
            else if ((axis == LYXP_AXIS_CHILD) && (local_140 != (lysc_node *)0x0)) {
              local_108 = (lyd_node *)0x0;
              uVar1 = local_140->nodetype;
              if ((local_f0 == (ly_path_predicate *)0x0) && ((uVar1 & 0x18) != 0)) {
                __assert_fail("scnode && (!(scnode->nodetype & (LYS_LIST | LYS_LEAFLIST)) || predicates)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0x1846,
                              "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                             );
              }
              memset(&local_c8,0,0x90);
              if (set != (lyxp_set *)0x0) {
                local_c8.non_child_axis = set->non_child_axis;
                local_c8.not_found = set->not_found;
                local_c8.ctx = set->ctx;
                local_c8.field_10 = set->field_10;
                local_c8.root_type = set->root_type;
                local_c8.context_op = set->context_op;
                local_c8.tree = set->tree;
                local_c8.cur_mod = set->cur_mod;
                local_c8.format = set->format;
                local_c8.prefix_data._0_4_ = *(undefined4 *)&set->prefix_data;
                local_c8.prefix_data._4_4_ = *(undefined4 *)((long)&set->prefix_data + 4);
                local_c8.vars._0_4_ = *(undefined4 *)&set->vars;
                local_c8.vars._4_4_ = *(undefined4 *)((long)&set->vars + 4);
              }
              LVar12 = LY_SUCCESS;
              if ((local_164 & 0x20) == 0) {
                lVar2 = set->type;
                if ((long)(int)lVar2 == 0) {
                  if (((set->root_type == LYXP_NODE_ROOT_CONFIG) && ((local_140->flags & 2) != 0))
                     || ((set->context_op != (lysc_node *)0x0 &&
                         (set->context_op != local_140 && (uVar1 & 0x700) != 0)))) {
                    lyxp_set_free_content(set);
                  }
                  else {
                    if (uVar1 == 8) {
                      LVar12 = lyd_create_term2(local_140,
                                                &(predicates->field_1).field_1.field_1.value,
                                                &local_108);
LAB_001ac6c5:
                      if (LVar12 != LY_SUCCESS) goto LAB_001ac37e;
                    }
                    else if (uVar1 == 0x10) {
                      LVar12 = lyd_create_list(local_140,predicates,(lyxp_var *)0x0,'\x01',
                                               &local_108);
                      goto LAB_001ac6c5;
                    }
                    if (set->used != 0) {
                      lVar25 = 0;
                      uVar34 = 0;
                      do {
                        plVar5 = (set->val).nodes;
                        iVar10 = *(int *)((long)&plVar5->type + lVar25);
                        if (iVar10 - 1U < 2) {
                          if (*(long *)((long)&plVar5->node + lVar25) != 0) {
                            __assert_fail("!set->val.nodes[i].node",
                                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                          ,0x186a,
                                          "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                                         );
                          }
                          plVar35 = set->tree;
                        }
                        else if (((iVar10 == 3) &&
                                 (lVar7 = *(long *)((long)&plVar5->node + lVar25), lVar7 != 0)) &&
                                ((*(ushort **)(lVar7 + 8) == (ushort *)0x0 ||
                                 ((**(ushort **)(lVar7 + 8) & 0x711) != 0)))) {
                          plVar35 = *(lyd_node **)(lVar7 + 0x38);
                        }
                        else {
                          plVar35 = (lyd_node *)0x0;
                        }
                        if (local_108 == (lyd_node *)0x0) {
                          LVar12 = lyd_find_sibling_val(plVar35,local_140,(char *)0x0,0,&sub);
                        }
                        else {
                          LVar12 = lyd_find_sibling_first(plVar35,local_108,&sub);
                        }
                        if (LVar12 == LY_ENOTFOUND) {
                          LVar12 = lyd_find_sibling_opaq_next(plVar35,local_140->name,&sub);
                        }
                        if ((LVar12 != LY_ENOTFOUND) && (LVar12 != LY_SUCCESS)) goto LAB_001ac37e;
                        if ((sub == (lyd_node *)0x0 || (local_164 & 1) != 0) ||
                           (plVar21 = lysc_has_when(sub->schema), plVar21 == (lysc_when *)0x0)) {
                          if (sub != (lyd_node *)0x0) goto LAB_001ac7da;
                        }
                        else {
                          if ((sub->flags & 2) == 0) {
                            LVar12 = LY_EINCOMPLETE;
                            goto LAB_001ac37e;
                          }
LAB_001ac7da:
                          set_insert_node(&local_c8,sub,0,LYXP_NODE_ELEM,local_c8.used);
                        }
                        uVar34 = uVar34 + 1;
                        lVar25 = lVar25 + 0x10;
                      } while (uVar34 < set->used);
                    }
                    lyxp_set_free_content(set);
                    memcpy(set,&local_c8,0x90);
                    local_c8.type = LYXP_SET_NUMBER;
                    iVar10 = set_sort(set);
                    LVar12 = LY_SUCCESS;
                    if (iVar10 != 0) {
                      __assert_fail("!set_sort(set)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                    ,0x188f,
                                    "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                                   );
                    }
                  }
                }
                else {
                  if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
                    uVar33 = *(undefined8 *)(&DAT_001fe698 + (long)(int)lVar2 * 8);
                  }
                  else {
                    uVar33 = 0;
                  }
                  ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                          "path operator",uVar33);
                  LVar12 = LY_EVALID;
                }
              }
LAB_001ac37e:
              lyxp_set_free_content(&local_c8);
              lyd_free_tree(local_108);
            }
            else {
              if ((all_desc != '\0') &&
                 (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,local_164),
                 LVar12 != LY_SUCCESS)) goto LAB_001ac3f1;
              LVar12 = moveto_node(set,moveto_mod,ncname_dict,axis,local_164);
            }
            if (LVar12 == LY_SUCCESS) goto LAB_001ac3a6;
            goto LAB_001ac3f1;
          }
          uVar34 = (ulong)set->used;
          if (uVar34 == 0) {
LAB_001ab92c:
            plVar28 = (lyxp_set_scnode *)0x0;
          }
          else {
            plVar14 = (set->val).scnodes;
            plVar28 = (lyxp_set_scnode *)0x0;
            uVar26 = uVar34;
            do {
              if ((plVar14->in_ctx == 2) &&
                 (bVar37 = plVar28 != (lyxp_set_scnode *)0x0, plVar28 = plVar14, bVar37))
              goto LAB_001ab92c;
              plVar14 = plVar14 + 1;
              uVar26 = uVar26 - 1;
            } while (uVar26 != 0);
          }
          if (axis == LYXP_AXIS_CHILD && all_desc != '\0') {
            lVar2 = set->type;
            if ((ulong)lVar2 == 1) {
              LVar12 = LY_SUCCESS;
              if (uVar34 != 0) {
                local_128 = ncname_dict;
                uVar26 = 0;
                local_118 = uVar34;
                do {
                  iVar10 = *(int *)((long)(set->val).nodes + uVar26 * 0x18 + 0xc);
                  if (iVar10 == -2) {
                    uVar30 = 0xffffffff;
LAB_001ab9a3:
                    *(undefined4 *)((long)(set->val).nodes + uVar26 * 0x18 + 0xc) = uVar30;
                    iVar10 = *(int *)((long)(set->val).nodes + uVar26 * 0x18 + 8);
                    if (iVar10 - 1U < 2) {
                      local_c8.type = LYXP_SET_NODE_SET;
                      plVar15 = ly_ctx_get_module_iter(set->ctx,&local_c8.type);
                      while (uVar34 = local_118, plVar15 != (lys_module *)0x0) {
                        if (plVar15->compiled != (lysc_module *)0x0) {
                          plVar16 = (lysc_node *)0x0;
                          while (plVar16 = lys_getnext(plVar16,(lysc_node *)0x0,plVar15->compiled,0)
                                , plVar16 != (lysc_node *)0x0) {
                            LVar12 = moveto_scnode_dfs(set,plVar16,(uint32_t)uVar26,plVar19,
                                                       local_128,local_164);
                            if (LVar12 != LY_SUCCESS) {
                              LVar12 = LY_EMEM;
                              goto LAB_001ac158;
                            }
                          }
                        }
                        plVar15 = ly_ctx_get_module_iter(set->ctx,&local_c8.type);
                      }
                    }
                    else if ((iVar10 == 3) &&
                            (LVar12 = moveto_scnode_dfs(set,*(lysc_node **)
                                                             ((long)(set->val).nodes + uVar26 * 0x18
                                                             ),(uint32_t)uVar26,plVar19,local_128,
                                                        local_164), uVar34 = local_118,
                            LVar12 != LY_SUCCESS)) break;
                  }
                  else if (iVar10 == 2) {
                    uVar30 = 0;
                    goto LAB_001ab9a3;
                  }
                  uVar26 = uVar26 + 1;
                  LVar12 = LY_SUCCESS;
                } while (uVar26 != uVar34);
              }
            }
            else {
              if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
                uVar33 = *(undefined8 *)(&DAT_001fe678 + (ulong)lVar2 * 8);
              }
              else {
                uVar33 = 0;
              }
              ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                      "path operator",uVar33);
              LVar12 = LY_EVALID;
            }
          }
          else {
            if ((all_desc != '\0') &&
               (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,local_164),
               LVar12 != LY_SUCCESS)) goto LAB_001ac3f1;
            LVar12 = moveto_scnode(set,moveto_mod,ncname_dict,axis,local_164);
          }
LAB_001ac158:
          pcVar31 = ncname;
          if (LVar12 != LY_SUCCESS) goto LAB_001ac3f1;
          uVar11 = set->used;
          do {
            uVar11 = uVar11 - 1;
            iVar10 = *(int *)((long)(set->val).nodes + (ulong)uVar11 * 0x18 + 0xc);
            if (uVar11 == 0) break;
          } while (iVar10 < 1);
          if (0 < iVar10) goto LAB_001ac3a6;
          uVar34 = (ulong)ncname_len;
          pcVar13 = exp->expr;
          pcVar27 = lysc_path((set->field_10).cur_scnode,LYSC_PATH_LOG,(char *)0x0,0);
          if (plVar28 == (lyxp_set_scnode *)0x0) {
LAB_001ac4e8:
            if ((local_164 & 0x40) == 0) {
              ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                     "Schema node \"%.*s\" not found; in expr \"%.*s\" with context node \"%s\".",
                     uVar34,pcVar31,pcVar31 + (uVar34 - (long)pcVar13),pcVar13,pcVar27);
              pcVar20 = (char *)0x0;
              goto LAB_001ac538;
            }
            ly_log(set->ctx,LY_LLERR,LY_ENOTFOUND,
                   "Schema node \"%.*s\" not found; in expr \"%.*s\" with context node \"%s\".",
                   uVar34,pcVar31,pcVar31 + (uVar34 - (long)pcVar13),pcVar13,pcVar27);
            pcVar20 = (char *)0x0;
LAB_001ac59f:
            free(pcVar27);
            free(pcVar20);
            set->not_found = '\x01';
          }
          else {
            lVar4 = plVar28->type;
            if (lVar4 == LYXP_NODE_ROOT) {
              pcVar20 = "<root>";
LAB_001ac48a:
              pcVar20 = strdup(pcVar20);
            }
            else {
              if (lVar4 == LYXP_NODE_ROOT_CONFIG) {
                pcVar20 = "<config-root>";
                goto LAB_001ac48a;
              }
              if (lVar4 != LYXP_NODE_ELEM) goto LAB_001ac4e8;
              pcVar20 = lysc_path(plVar28->scnode,LYSC_PATH_LOG,(char *)0x0,0);
            }
            if (pcVar20 == (char *)0x0) goto LAB_001ac4e8;
            if ((local_164 & 0x40) != 0) {
              ly_log(set->ctx,LY_LLERR,LY_ENOTFOUND,
                     "Schema node \"%.*s\" for parent \"%s\" not found; in expr \"%.*s\" with context node \"%s\"."
                     ,uVar34,pcVar31,pcVar20,pcVar31 + (uVar34 - (long)pcVar13),pcVar13,pcVar27);
              goto LAB_001ac59f;
            }
            ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                   "Schema node \"%.*s\" for parent \"%s\" not found; in expr \"%.*s\" with context node \"%s\"."
                   ,uVar34,pcVar31,pcVar20,pcVar31 + (uVar34 - (long)pcVar13),pcVar13,pcVar27);
LAB_001ac538:
            free(pcVar27);
            free(pcVar20);
          }
          uVar29 = local_164 | 0x20;
          LVar24 = LY_ENOT;
        }
        do {
          LVar12 = LVar24;
          if ((exp->used == *tok_idx) || (exp->tokens[*tok_idx] != LYXP_TOKEN_BRACK1)) break;
          LVar12 = eval_predicate(exp,tok_idx,set,uVar29,axis);
        } while (LVar12 == LY_SUCCESS);
      }
LAB_001ac3f1:
      lydict_remove(set->ctx,ncname_dict);
      if (local_f0 != (ly_path_predicate *)0x0) {
        ly_path_predicates_free(local_140->module->ctx,local_f0);
      }
      if (LVar12 != LY_SUCCESS) {
        if (LVar12 != LY_ENOT) {
          return LVar12;
        }
        if ((local_164 & 0x1c) == 0) {
          __assert_fail("options & LYXP_SCNODE_ALL",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2115,
                        "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        local_164 = local_164 | 0x20;
      }
      break;
    case LYXP_TOKEN_NODETYPE:
      pcVar31 = "skipped";
      if ((local_164 & 0x20) == 0) {
        if (exp->tok_len[uVar34] != 4) {
          __assert_fail("exp->tok_len[*tok_idx] == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2086,
                        "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        uVar11 = exp->tok_pos[uVar34];
        pcVar31 = exp->expr;
        iVar10 = strncmp(pcVar31 + uVar11,"node",4);
        if (iVar10 == 0) {
          LVar12 = xpath_pi_node(set,axis,local_164);
          pcVar31 = "parsed";
          if (LVar12 != LY_SUCCESS) {
            return LVar12;
          }
        }
        else {
          iVar10 = strncmp(pcVar31 + uVar11,"text",4);
          if (iVar10 != 0) {
            __assert_fail("!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], \"text\", 4)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x208a,
                          "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                         );
          }
          if ((local_164 & 0x1c) == 0) {
            lVar2 = set->type;
            if ((long)(int)lVar2 != 0) {
              plVar32 = set->ctx;
              if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
                pcVar31 = *(char **)(&DAT_001fe698 + (long)(int)lVar2 * 8);
              }
              else {
                pcVar31 = (char *)0x0;
              }
              pcVar27 = "Invalid context type %s in %s.";
              pcVar13 = "text()";
              goto LAB_001ac8dd;
            }
            if (axis != LYXP_AXIS_CHILD) {
              lyxp_set_free_content(set);
              goto LAB_001abf56;
            }
            uVar11 = set->used;
            if (uVar11 != 0) {
              lVar25 = 8;
              uVar34 = 0;
              do {
                plVar5 = (set->val).nodes;
                uVar3 = *(uint *)((long)&plVar5->node + lVar25);
                if (uVar3 < 6) {
                  if ((0x36U >> (uVar3 & 0x1f) & 1) == 0) {
                    if (uVar3 != 3) {
                      plVar32 = set->ctx;
                      uVar33 = 0x1601;
                      goto LAB_001ac8ad;
                    }
                    pbVar6 = *(byte **)(*(long *)((long)plVar5 + lVar25 + -8) + 8);
                    if ((pbVar6 == (byte *)0x0) || ((*pbVar6 & 0xc) != 0)) {
                      *(undefined4 *)((long)&plVar5->node + lVar25) = 4;
                      goto LAB_001abb1c;
                    }
                  }
                  set_remove_node_none(set,(uint32_t)uVar34);
                  uVar11 = set->used;
                }
LAB_001abb1c:
                uVar34 = uVar34 + 1;
                lVar25 = lVar25 + 0x10;
              } while (uVar34 < uVar11);
            }
            set_remove_nodes_none(set);
            pcVar31 = "parsed";
          }
          else {
            uVar11 = set->used;
            pcVar31 = "parsed";
            if ((ulong)uVar11 != 0) {
              lVar25 = 0;
              do {
                iVar10 = *(int *)((long)&((set->val).nodes)->pos + lVar25);
                if (iVar10 == 2) {
                  uVar30 = 1;
LAB_001ab51e:
                  *(undefined4 *)((long)&((set->val).nodes)->pos + lVar25) = uVar30;
                }
                else if (iVar10 == -2) {
                  uVar30 = 0xffffffff;
                  goto LAB_001ab51e;
                }
                lVar25 = lVar25 + 0x18;
              } while ((ulong)uVar11 * 0x18 != lVar25);
LAB_001abf56:
              pcVar31 = "parsed";
            }
          }
        }
      }
      pcVar13 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar31,pcVar13,
                 (ulong)exp->tok_pos[*tok_idx]);
      uVar11 = *tok_idx + 1;
      *tok_idx = uVar11;
      if (exp->tokens[uVar11] != LYXP_TOKEN_PAR1) {
        __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x2094,
                      "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar31,"(",
                 (ulong)exp->tok_pos[uVar11]);
      uVar11 = *tok_idx + 1;
      *tok_idx = uVar11;
      if (exp->tokens[uVar11] != LYXP_TOKEN_PAR2) {
        __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x209a,
                      "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar31,")",
                 (ulong)exp->tok_pos[uVar11]);
      *tok_idx = *tok_idx + 1;
      while ((exp->used != *tok_idx && (exp->tokens[*tok_idx] == LYXP_TOKEN_BRACK1))) {
        LVar12 = eval_predicate(exp,tok_idx,set,local_164,axis);
        if (LVar12 != LY_SUCCESS) {
          return LVar12;
        }
      }
    }
    uVar11 = *tok_idx;
    if ((exp->used == uVar11) || ((exp->tokens[uVar11] & ~LYXP_TOKEN_PAR1) != LYXP_TOKEN_OPER_PATH))
    {
      return LY_SUCCESS;
    }
    if (exp->tok_len[uVar11] == 1) {
      all_desc = '\0';
    }
    else {
      if (exp->tok_len[uVar11] != 2) {
        __assert_fail("exp->tok_len[*tok_idx] == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x20c4,
                      "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      all_desc = '\x01';
    }
    pcVar31 = "skipped";
    if ((local_164 & 0x20) == 0) {
      pcVar31 = "parsed";
    }
    pcVar13 = lyxp_token2str(exp->tokens[uVar11]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar31,pcVar13,
               (ulong)exp->tok_pos[*tok_idx]);
    uVar11 = *tok_idx + 1;
    *tok_idx = uVar11;
  } while( true );
}

Assistant:

static LY_ERR
eval_relative_location_path(const struct lyxp_expr *exp, uint32_t *tok_idx, ly_bool all_desc, struct lyxp_set *set,
        uint32_t options)
{
    LY_ERR rc = LY_SUCCESS;
    enum lyxp_axis axis;
    int scnode_skip_path = 0;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*tok_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*tok_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

step:
        /* AxisSpecifier */
        if (exp->tokens[*tok_idx] == LYXP_TOKEN_AXISNAME) {
            axis = str2axis(exp->expr + exp->tok_pos[*tok_idx], exp->tok_len[*tok_idx]);

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);

            assert(exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON);
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else if (exp->tokens[*tok_idx] == LYXP_TOKEN_AT) {
            axis = LYXP_AXIS_ATTRIBUTE;

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else {
            /* default */
            axis = LYXP_AXIS_CHILD;
        }

        /* NodeTest Predicate* */
        switch (exp->tokens[*tok_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_SELF, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_PARENT, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_NAMETEST:
            /* evaluate NameTest Predicate* */
            rc = eval_name_test_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            if (rc == LY_ENOT) {
                assert(options & LYXP_SCNODE_ALL);
                rc = LY_SUCCESS;

                /* skip the rest of this path */
                scnode_skip_path = 1;
                options |= LYXP_SKIP_EXPR;
            }
            LY_CHECK_GOTO(rc, cleanup);
            break;

        case LYXP_TOKEN_NODETYPE:
            /* evaluate NodeType Predicate* */
            rc = eval_node_type_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            LY_CHECK_GOTO(rc, cleanup);
            break;

        default:
            LOGINT(set->ctx);
            rc = LY_EINT;
            goto cleanup;
        }
    } while (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH));

cleanup:
    if (scnode_skip_path) {
        options &= ~LYXP_SKIP_EXPR;
    }
    return rc;
}